

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edithdu.c
# Opt level: O2

int ffwrhdu(fitsfile *infptr,FILE *outstream,int *status)

{
  long lVar1;
  bool bVar2;
  LONGLONG hduend;
  LONGLONG hdustart;
  char buffer [2880];
  
  if (0 < *status) {
    return *status;
  }
  ffghadll(infptr,&hdustart,(LONGLONG *)0x0,&hduend,status);
  lVar1 = (hduend - hdustart) / 0xb40;
  if (0xb3f < hduend - hdustart) {
    ffmbyt(infptr,hdustart,0,status);
    while (bVar2 = lVar1 != 0, lVar1 = lVar1 + -1, bVar2) {
      ffgbyt(infptr,0xb40,buffer,status);
      fwrite(buffer,1,0xb40,(FILE *)outstream);
    }
  }
  return *status;
}

Assistant:

int ffwrhdu(fitsfile *infptr,    /* I - FITS file pointer to input file  */
            FILE *outstream,     /* I - stream to write HDU to */
            int *status)         /* IO - error status     */
{
/*
  write the data unit from the CHDU of infptr to the output file stream
*/
    long nb, ii;
    LONGLONG hdustart, hduend;
    char buffer[2880];

    if (*status > 0)
        return(*status);

    ffghadll(infptr, &hdustart,  NULL, &hduend, status);

    nb = (long) ((hduend - hdustart) / 2880);  /* number of blocks to copy */

    if (nb > 0)
    {

        /* move to the start of the HDU */
        ffmbyt(infptr,  hdustart,  REPORT_EOF, status);

        for (ii = 0; ii < nb; ii++)
        {
            ffgbyt(infptr,  2880L, buffer, status); /* read input block */
            fwrite(buffer, 1, 2880, outstream ); /* write to output stream */
        }
    }
    return(*status);
}